

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::pop_context(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,regex_impl *impl,bool success)

{
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  match_results *pmVar2;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar4;
  matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar5;
  traits<char> *ptVar6;
  undefined7 in_register_00000011;
  
  pmVar1 = (this->context_).prev_context_;
  if ((int)CONCAT71(in_register_00000011,success) == 0) {
    pmVar2 = pmVar1->results_ptr_;
    uninit_(this,impl,pmVar2);
    results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reclaim_last(&this->extras_->results_cache_,&pmVar2->nested_results_);
  }
  pmVar4 = pmVar1->prev_context_;
  pmVar5 = pmVar1->next_ptr_;
  ptVar6 = pmVar1->traits_;
  (this->context_).results_ptr_ = pmVar1->results_ptr_;
  (this->context_).prev_context_ = pmVar4;
  (this->context_).next_ptr_ = pmVar5;
  (this->context_).traits_ = ptVar6;
  pmVar3 = (this->context_).results_ptr_;
  this->sub_matches_ = (pmVar3->sub_matches_).sub_matches_;
  this->mark_count_ = (pmVar3->sub_matches_).size_;
  return success;
}

Assistant:

bool pop_context(regex_impl const &impl, bool success)
    {
        match_context &context = *this->context_.prev_context_;
        if(!success)
        {
            match_results &what = *context.results_ptr_;
            this->uninit_(impl, what);

            // send the match_results struct back to the cache
            nested_results<BidiIter> &nested = access::get_nested_results(what);
            this->extras_->results_cache_.reclaim_last(nested);
        }

        // restore the state
        this->context_ = context;
        match_results &results = *this->context_.results_ptr_;
        this->sub_matches_ = access::get_sub_matches(access::get_sub_match_vector(results));
        this->mark_count_ = results.size();
        return success;
    }